

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxSerialize.cpp
# Opt level: O2

void __thiscall Jinx::Impl::BinaryReader::Read(BinaryReader *this,BufferPtr *val)

{
  undefined8 in_RAX;
  uint32_t size;
  
  size = (uint32_t)((ulong)in_RAX >> 0x20);
  Buffer::Read((this->m_buffer).super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               &this->m_pos,&size,4);
  Buffer::Reserve((val->super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                  (ulong)size);
  Buffer::Read((this->m_buffer).super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               &this->m_pos,val,(ulong)size);
  return;
}

Assistant:

inline_t void BinaryReader::Read(BufferPtr & val)
	{
		uint32_t size;
		m_buffer->Read(&m_pos, &size, sizeof(size));
		val->Reserve(size);
		m_buffer->Read(&m_pos, val, size);
	}